

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_dispatch.c
# Opt level: O3

cpu_feature get_cpu_features(void)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  uint in_XCR0;
  
  if (g_cpu_features == UNDEFINED) {
    piVar1 = (int *)cpuid_basic_info(0);
    lVar2 = cpuid_Version_info(1);
    uVar3 = *(uint *)(lVar2 + 0xc);
    g_cpu_features = (uVar3 >> 0x11 & 4) + 1 + (uVar3 & 1) * 2;
    if ((((uVar3 >> 0x1b & 1) != 0) && ((~in_XCR0 & 6) == 0)) &&
       (g_cpu_features = g_cpu_features + (uVar3 >> 0x1c & 1) * 8, 6 < *piVar1)) {
      lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar3 = *(uint *)(lVar2 + 4);
      g_cpu_features = g_cpu_features | uVar3 >> 1 & AVX2;
      if ((~in_XCR0 & 0xe0) == 0) {
        g_cpu_features =
             uVar3 >> 0xb & AVX512F | uVar3 >> 0x19 & ~(AVX512F|AVX2|AVX|SSE41|SSSE3|SSE2) |
             g_cpu_features;
      }
    }
  }
  return g_cpu_features;
}

Assistant:

enum cpu_feature get_cpu_features()
{
    
    if( g_cpu_features != UNDEFINED ) {
        return g_cpu_features;
    } else {
#if defined(IS_X86)
        uint32_t regs[4] = {0};
        uint32_t * eax = &regs[0], * ebx = &regs[1], * ecx = &regs[2], * edx = &regs[3];
        (void)edx;
        enum cpu_feature features = 0;
        cpuid(regs, 0);
        const int max_id = *eax;
        cpuid(regs, 1);
    #if defined(__amd64__) || defined(_M_X64)
        features |= SSE2;
    #else
        if(*edx & (1UL << 26))
            features |= SSE2;
    #endif
        if(*ecx & (1UL << 0))
            features |= SSSE3;
        if(*ecx & (1UL << 19))
            features |= SSE41;

        if( *ecx & (1UL << 27) ) { // OSXSAVE
            const uint64_t mask = xgetbv();
            if( (mask & 6) == 6 ) { // SSE and AVX states
                if(*ecx & (1UL << 28))
                    features |= AVX;
                if(max_id >= 7) {
                    cpuidex(regs, 7, 0);
                    if( *ebx & (1UL << 5) )
                        features |= AVX2;
                    if( (mask & 224) == 224 ) { // Opmask, ZMM_Hi256, Hi16_Zmm
                        if( *ebx & (1UL << 31) )
                            features |= AVX512VL;
                        if(*ebx & (1UL << 16))
                            features |= AVX512F;
                    }
                }
            }
        }
        g_cpu_features = features;
        return features;
#elif defined(IS_ARM)
        /* How to detect NEON? */
        return 0;
#else
        return 0;
#endif
    }
}